

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmrc.hpp
# Opt level: O0

int __thiscall
cmrc::embedded_filesystem::open(embedded_filesystem *this,char *__file,int __oflag,...)

{
  bool bVar1;
  file_or_directory *this_00;
  system_error *this_01;
  file_data *pfVar2;
  error_code eVar3;
  error_code __ec;
  file_data *dat;
  string local_50;
  file_or_directory *local_30;
  file_or_directory *entry_ptr;
  string *path_local;
  embedded_filesystem *this_local;
  
  entry_ptr = (file_or_directory *)__file;
  path_local = (string *)this;
  std::__cxx11::string::string((string *)&local_50,(string *)__file);
  this_00 = _get(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  local_30 = this_00;
  if (this_00 != (file_or_directory *)0x0) {
    bVar1 = detail::file_or_directory::is_file(this_00);
    if (bVar1) {
      pfVar2 = detail::file_or_directory::as_file(local_30);
      file::file((file *)&this_local,pfVar2->begin_ptr,pfVar2->end_ptr);
      return (int)this_local;
    }
  }
  this_01 = (system_error *)__cxa_allocate_exception(0x20);
  eVar3 = std::make_error_code(no_such_file_or_directory);
  __ec._M_cat = eVar3._M_cat;
  __ec._4_4_ = 0;
  __ec._M_value = eVar3._M_value;
  std::system_error::system_error(this_01,__ec,(string *)entry_ptr);
  __cxa_throw(this_01,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

file open(const std::string& path) const {
        auto entry_ptr = _get(path);
        if (!entry_ptr || !entry_ptr->is_file()) {
#ifdef CMRC_NO_EXCEPTIONS
            fprintf(stderr, "Error no such file or directory: %s\n", path.c_str());
            abort();
#else
            throw std::system_error(make_error_code(std::errc::no_such_file_or_directory), path);
#endif
        }
        auto& dat = entry_ptr->as_file();
        return file{dat.begin_ptr, dat.end_ptr};
    }